

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O2

void __thiscall TestRegistry::listTestGroupNames(TestRegistry *this,TestResult *result)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar4;
  SimpleString gname;
  SimpleString groupList;
  SimpleString local_50;
  SimpleString local_48;
  TestResult *local_40;
  UtestShell *pUVar3;
  
  local_40 = result;
  SimpleString::SimpleString(&local_48,"");
  pUVar3 = this->tests_;
  while (pUVar3 != (UtestShell *)0x0) {
    SimpleString::SimpleString(&local_50,"");
    SimpleString::operator+=(&local_50,"#");
    UtestShell::getGroup((UtestShell *)&stack0xffffffffffffffc8);
    SimpleString::operator+=(&local_50,(SimpleString *)&stack0xffffffffffffffc8);
    SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc8);
    SimpleString::operator+=(&local_50,"#");
    bVar1 = SimpleString::contains(&local_48,&local_50);
    if (!bVar1) {
      SimpleString::operator+=(&local_48,&local_50);
      SimpleString::operator+=(&local_48," ");
    }
    SimpleString::~SimpleString(&local_50);
    iVar2 = (*pUVar3->_vptr_UtestShell[3])(pUVar3);
    pUVar3 = (UtestShell *)CONCAT44(extraout_var,iVar2);
  }
  SimpleString::replace(&local_48,"#","");
  SimpleString::SimpleString(&local_50," ");
  bVar1 = SimpleString::endsWith(&local_48,&local_50);
  SimpleString::~SimpleString(&local_50);
  if (bVar1) {
    SimpleString::size(&local_48);
    SimpleString::subString(&local_50,(size_t)&local_48,0);
    SimpleString::operator=(&local_48,&local_50);
    SimpleString::~SimpleString(&local_50);
  }
  pcVar4 = SimpleString::asCharString(&local_48);
  (*local_40->_vptr_TestResult[0xe])(local_40,pcVar4);
  SimpleString::~SimpleString(&local_48);
  return;
}

Assistant:

void TestRegistry::listTestGroupNames(TestResult& result)
{
    SimpleString groupList;

    for (UtestShell *test = tests_; test != NULL; test = test->getNext()) {
        SimpleString gname;
        gname += "#";
        gname += test->getGroup();
        gname += "#";

        if (!groupList.contains(gname)) {
            groupList += gname;
            groupList += " ";
        }
    }

    groupList.replace("#", "");

    if (groupList.endsWith(" "))
        groupList = groupList.subString(0, groupList.size() - 1);
    result.print(groupList.asCharString());
}